

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::ComplexOptionType1::_InternalSerialize
          (ComplexOptionType1 *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  uint uVar1;
  bool bVar2;
  int iVar3;
  const_reference piVar4;
  byte *pbVar5;
  uint8_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  int index;
  
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.foo_,target);
  }
  if ((uVar1 & 2) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>
                       (stream,(this->field_0)._impl_.foo2_,target);
  }
  if ((uVar1 & 4) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                       (stream,(this->field_0)._impl_.foo3_,target);
  }
  this_00 = &(this->field_0)._impl_.foo4_;
  iVar3 = google::protobuf::internal::SooRep::size
                    (&this_00->soo_rep_,(*(byte *)((long)&this->field_0 + 0x20) & 4) == 0);
  if (0 < iVar3) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      piVar4 = google::protobuf::RepeatedField<int>::Get(this_00,index);
      uVar7 = (ulong)*piVar4;
      pbVar5 = target + 1;
      *target = 0x20;
      uVar8 = uVar7;
      if (0x7f < uVar7) {
        do {
          *pbVar5 = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          pbVar5 = pbVar5 + 1;
          bVar2 = 0x3fff < uVar8;
          uVar8 = uVar7;
        } while (bVar2);
      }
      *pbVar5 = (byte)uVar7;
      target = pbVar5 + 1;
      index = index + 1;
    } while (index != iVar3);
  }
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_ComplexOptionType1_default_instance_,target,stream);
  }
  uVar8 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar8 & 1) != 0) {
    puVar6 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar8 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar6;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL ComplexOptionType1::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const ComplexOptionType1& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.ComplexOptionType1)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional int32 foo = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_foo(), target);
  }

  // optional int32 foo2 = 2;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<2>(
            stream, this_._internal_foo2(), target);
  }

  // optional int32 foo3 = 3;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_foo3(), target);
  }

  // repeated int32 foo4 = 4;
  for (int i = 0, n = this_._internal_foo4_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        4, this_._internal_foo4().Get(i), target);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.ComplexOptionType1)
  return target;
}